

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree::first_visible_item(Fl_Tree *this)

{
  Fl_Tree_Item *item;
  
  item = this->_root;
  if ((this->_prefs)._showroot == '\0') {
    item = next(this,item);
  }
  for (; (item != (Fl_Tree_Item *)0x0 && (item->_visible == '\0')); item = Fl_Tree_Item::next(item))
  {
  }
  return item;
}

Assistant:

Fl_Tree_Item* Fl_Tree::first_visible_item() {
  Fl_Tree_Item *i = showroot() ? first() : next(first());
  while ( i ) {
    if ( i->visible() ) return(i);
    i = next(i);
  }
  return(0);
}